

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_SubDComponentFilter::AcceptComponent(ON_SubDComponentFilter *this,ON_SubDComponentPtr cptr)

{
  bool bVar1;
  ON_SubDFace *f;
  ON_SubDVertex *v;
  ON_SubDEdge *e;
  uint uVar2;
  
  uVar2 = (uint)cptr.m_ptr & 6;
  switch(uVar2) {
  case 0:
    return false;
  case 2:
    v = (ON_SubDVertex *)0x0;
    if (uVar2 == 2) {
      v = (ON_SubDVertex *)(cptr.m_ptr & 0xfffffffffffffff8);
    }
    break;
  case 4:
    e = (ON_SubDEdge *)0x0;
    if (uVar2 == 4) {
      e = (ON_SubDEdge *)(cptr.m_ptr & 0xfffffffffffffff8);
    }
    bVar1 = AcceptEdge(this,e);
    return bVar1;
  case 6:
    f = (ON_SubDFace *)0x0;
    if (uVar2 == 6) {
      f = (ON_SubDFace *)(cptr.m_ptr & 0xfffffffffffffff8);
    }
    bVar1 = AcceptFace(this,f);
    return bVar1;
  }
  bVar1 = AcceptVertex(this,v);
  return bVar1;
}

Assistant:

ON_SubDComponentPtr::Type ON_SubDComponentPtr::ComponentType() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
    return ON_SubDComponentPtr::Type::Vertex;
  case ON_SUBD_COMPONENT_TYPE_EDGE:
    return ON_SubDComponentPtr::Type::Edge;
  case ON_SUBD_COMPONENT_TYPE_FACE:
    return ON_SubDComponentPtr::Type::Face;
  }
  return ON_SubDComponentPtr::Type::Unset;
}